

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArrayDimensionFunction::ArrayDimensionFunction
          (ArrayDimensionFunction *this,KnownSystemName knownNameId,bool unpackedOnly)

{
  byte in_DL;
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__ArrayDimensionFunction_00e57310;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  return;
}

Assistant:

ArrayDimensionFunction(KnownSystemName knownNameId, bool unpackedOnly) :
        SystemSubroutine(knownNameId, FUNC), unpackedOnly(unpackedOnly) {}